

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Geometry *pGVar4;
  RTCIntersectArguments *pRVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar20;
  long lVar21;
  byte bVar22;
  ulong uVar23;
  ulong uVar24;
  byte bVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined4 uVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  uint uVar70;
  uint uVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  long lStack_2600;
  byte local_25f0;
  int local_25bc;
  ulong local_25b8;
  StackItemT<embree::NodeRefPtr<8>_> *local_25b0;
  RayQueryContext *local_25a8;
  long local_25a0;
  long local_2598;
  Scene *local_2590;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  float local_2528;
  float local_24b8 [4];
  float local_24a8 [4];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_25b0 = stack + 1;
    stack[0].dist = 0;
    aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar35 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar66 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar32._8_4_ = 0x7fffffff;
    auVar32._0_8_ = 0x7fffffff7fffffff;
    auVar32._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx512vl((undefined1  [16])aVar1,auVar32);
    auVar65._8_4_ = 0x219392ef;
    auVar65._0_8_ = 0x219392ef219392ef;
    auVar65._12_4_ = 0x219392ef;
    uVar28 = vcmpps_avx512vl(auVar32,auVar65,1);
    bVar31 = (bool)((byte)uVar28 & 1);
    auVar33._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * (int)aVar1.x;
    bVar31 = (bool)((byte)(uVar28 >> 1) & 1);
    auVar33._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * (int)aVar1.y;
    bVar31 = (bool)((byte)(uVar28 >> 2) & 1);
    auVar33._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * (int)aVar1.z;
    bVar31 = (bool)((byte)(uVar28 >> 3) & 1);
    auVar33._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * aVar1.field_3.a;
    auVar32 = vrcp14ps_avx512vl(auVar33);
    auVar34._8_4_ = 0x3f800000;
    auVar34._0_8_ = 0x3f8000003f800000;
    auVar34._12_4_ = 0x3f800000;
    auVar34 = vfnmadd213ps_avx512vl(auVar33,auVar32,auVar34);
    auVar33 = vfmadd132ps_fma(auVar34,auVar32,auVar32);
    auVar46 = vbroadcastss_avx512vl(auVar33);
    auVar76 = ZEXT3264(auVar46);
    auVar32 = vmovshdup_avx(auVar33);
    auVar46 = vbroadcastsd_avx512vl(auVar32);
    auVar77 = ZEXT3264(auVar46);
    auVar34 = vshufpd_avx(auVar33,auVar33,1);
    auVar50._8_4_ = 2;
    auVar50._0_8_ = 0x200000002;
    auVar50._12_4_ = 2;
    auVar50._16_4_ = 2;
    auVar50._20_4_ = 2;
    auVar50._24_4_ = 2;
    auVar50._28_4_ = 2;
    auVar46 = vpermps_avx512vl(auVar50,ZEXT1632(auVar33));
    auVar78 = ZEXT3264(auVar46);
    fVar56 = auVar33._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar51._4_4_ = fVar56;
    auVar51._0_4_ = fVar56;
    auVar51._8_4_ = fVar56;
    auVar51._12_4_ = fVar56;
    auVar51._16_4_ = fVar56;
    auVar51._20_4_ = fVar56;
    auVar51._24_4_ = fVar56;
    auVar51._28_4_ = fVar56;
    auVar46 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar79 = ZEXT3264(auVar46);
    auVar48 = ZEXT1632(CONCAT412(auVar33._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar33._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar33._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar56))
                                ));
    auVar47 = vpermps_avx512vl(auVar46,auVar48);
    auVar46 = vpermps_avx2(auVar50,auVar48);
    local_25b8 = (ulong)(auVar33._0_4_ < 0.0) << 5;
    uVar28 = (ulong)(auVar32._0_4_ < 0.0) << 5 | 0x40;
    uVar30 = (ulong)(auVar34._0_4_ < 0.0) << 5 | 0x80;
    uVar29 = local_25b8 ^ 0x20;
    uVar60 = auVar66._0_4_;
    auVar59 = ZEXT3264(CONCAT428(uVar60,CONCAT424(uVar60,CONCAT420(uVar60,CONCAT416(uVar60,CONCAT412
                                                  (uVar60,CONCAT48(uVar60,CONCAT44(uVar60,uVar60))))
                                                  ))));
    auVar49._8_4_ = 0x80000000;
    auVar49._0_8_ = 0x8000000080000000;
    auVar49._12_4_ = 0x80000000;
    auVar49._16_4_ = 0x80000000;
    auVar49._20_4_ = 0x80000000;
    auVar49._24_4_ = 0x80000000;
    auVar49._28_4_ = 0x80000000;
    auVar48 = vxorps_avx512vl(auVar51,auVar49);
    auVar80 = ZEXT3264(auVar48);
    auVar47 = vxorps_avx512vl(auVar47,auVar49);
    auVar81 = ZEXT3264(auVar47);
    auVar46 = vxorps_avx512vl(auVar46,auVar49);
    auVar82 = ZEXT3264(auVar46);
    auVar46 = vbroadcastss_avx512vl(auVar35);
    auVar83 = ZEXT3264(auVar46);
    auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar84 = ZEXT3264(auVar46);
    auVar46 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar85 = ZEXT3264(auVar46);
    auVar35 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar86 = ZEXT1664(auVar35);
    auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar87 = ZEXT3264(auVar46);
    auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
    auVar89 = ZEXT3264(auVar46);
    local_25a8 = context;
LAB_01c5666f:
    if (local_25b0 != stack) {
      pSVar20 = local_25b0 + -1;
      local_25b0 = local_25b0 + -1;
      if ((float)pSVar20->dist <= (ray->super_RayK<1>).tfar) {
        uVar24 = (local_25b0->ptr).ptr;
LAB_01c5668c:
        do {
          if ((uVar24 & 8) != 0) goto LAB_01c569ee;
          auVar46 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar24 + 0x40 + local_25b8),auVar80._0_32_,
                               auVar76._0_32_);
          auVar47 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar24 + 0x40 + uVar28),auVar81._0_32_,
                               auVar77._0_32_);
          auVar46 = vpmaxsd_avx2(auVar46,auVar47);
          auVar47 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar24 + 0x40 + uVar30),auVar82._0_32_,
                               auVar78._0_32_);
          auVar47 = vpmaxsd_avx512vl(auVar47,auVar83._0_32_);
          auVar46 = vpmaxsd_avx2(auVar46,auVar47);
          auVar47 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar24 + 0x40 + uVar29),auVar80._0_32_,
                               auVar76._0_32_);
          auVar48 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar28 ^ 0x20)),
                               auVar81._0_32_,auVar77._0_32_);
          auVar47 = vpminsd_avx2(auVar47,auVar48);
          auVar48 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar30 ^ 0x20)),
                               auVar82._0_32_,auVar78._0_32_);
          auVar48 = vpminsd_avx2(auVar48,auVar59._0_32_);
          auVar47 = vpminsd_avx2(auVar47,auVar48);
          uVar23 = vpcmpd_avx512vl(auVar46,auVar47,2);
          bVar25 = (byte)uVar23;
          if (bVar25 == 0) break;
          auVar47 = *(undefined1 (*) [32])(uVar24 & 0xfffffffffffffff0);
          auVar48 = ((undefined1 (*) [32])(uVar24 & 0xfffffffffffffff0))[1];
          auVar49 = vmovdqa64_avx512vl(auVar84._0_32_);
          auVar49 = vpternlogd_avx512vl(auVar49,auVar46,auVar85._0_32_,0xf8);
          auVar50 = vpcompressd_avx512vl(auVar49);
          auVar53._0_4_ =
               (uint)(bVar25 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar25 & 1) * auVar49._0_4_;
          bVar31 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar53._4_4_ = (uint)bVar31 * auVar50._4_4_ | (uint)!bVar31 * auVar49._4_4_;
          bVar31 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar53._8_4_ = (uint)bVar31 * auVar50._8_4_ | (uint)!bVar31 * auVar49._8_4_;
          bVar31 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar53._12_4_ = (uint)bVar31 * auVar50._12_4_ | (uint)!bVar31 * auVar49._12_4_;
          bVar31 = (bool)((byte)(uVar23 >> 4) & 1);
          auVar53._16_4_ = (uint)bVar31 * auVar50._16_4_ | (uint)!bVar31 * auVar49._16_4_;
          bVar31 = (bool)((byte)(uVar23 >> 5) & 1);
          auVar53._20_4_ = (uint)bVar31 * auVar50._20_4_ | (uint)!bVar31 * auVar49._20_4_;
          bVar31 = (bool)((byte)(uVar23 >> 6) & 1);
          auVar53._24_4_ = (uint)bVar31 * auVar50._24_4_ | (uint)!bVar31 * auVar49._24_4_;
          bVar31 = SUB81(uVar23 >> 7,0);
          auVar53._28_4_ = (uint)bVar31 * auVar50._28_4_ | (uint)!bVar31 * auVar49._28_4_;
          auVar49 = vpermt2q_avx512vl(auVar47,auVar53,auVar48);
          uVar24 = auVar49._0_8_;
          bVar25 = bVar25 - 1 & bVar25;
          if (bVar25 != 0) {
            auVar49 = vpshufd_avx2(auVar53,0x55);
            vpermt2q_avx512vl(auVar47,auVar49,auVar48);
            auVar50 = vpminsd_avx2(auVar53,auVar49);
            auVar49 = vpmaxsd_avx2(auVar53,auVar49);
            bVar25 = bVar25 - 1 & bVar25;
            if (bVar25 == 0) {
              auVar50 = vpermi2q_avx512vl(auVar50,auVar47,auVar48);
              uVar24 = auVar50._0_8_;
              auVar47 = vpermt2q_avx512vl(auVar47,auVar49,auVar48);
              (local_25b0->ptr).ptr = auVar47._0_8_;
              lVar21 = 8;
              lStack_2600 = 0x10;
            }
            else {
              auVar55 = vpshufd_avx2(auVar53,0xaa);
              vpermt2q_avx512vl(auVar47,auVar55,auVar48);
              auVar51 = vpminsd_avx2(auVar50,auVar55);
              auVar50 = vpmaxsd_avx2(auVar50,auVar55);
              auVar55 = vpminsd_avx2(auVar49,auVar50);
              auVar50 = vpmaxsd_avx2(auVar49,auVar50);
              bVar25 = bVar25 - 1 & bVar25;
              if (bVar25 == 0) {
                auVar49 = vpermi2q_avx512vl(auVar51,auVar47,auVar48);
                uVar24 = auVar49._0_8_;
                auVar49 = vpermt2q_avx512vl(auVar47,auVar50,auVar48);
                (local_25b0->ptr).ptr = auVar49._0_8_;
                auVar49 = vpermd_avx2(auVar50,auVar46);
                local_25b0->dist = auVar49._0_4_;
                auVar47 = vpermt2q_avx512vl(auVar47,auVar55,auVar48);
                local_25b0[1].ptr.ptr = auVar47._0_8_;
                lVar21 = 0x18;
                lStack_2600 = 0x20;
                auVar49 = auVar55;
              }
              else {
                auVar49 = vpshufd_avx2(auVar53,0xff);
                vpermt2q_avx512vl(auVar47,auVar49,auVar48);
                auVar88 = vpminsd_avx2(auVar51,auVar49);
                auVar51 = vpmaxsd_avx2(auVar51,auVar49);
                auVar49 = vpminsd_avx2(auVar55,auVar51);
                auVar51 = vpmaxsd_avx2(auVar55,auVar51);
                auVar55 = vpminsd_avx2(auVar50,auVar51);
                auVar50 = vpmaxsd_avx2(auVar50,auVar51);
                bVar25 = bVar25 - 1 & bVar25;
                if (bVar25 != 0) {
                  auVar52 = valignd_avx512vl(auVar53,auVar53,3);
                  auVar51 = vmovdqa64_avx512vl(auVar86._0_32_);
                  auVar53 = vmovdqa64_avx512vl(auVar86._0_32_);
                  auVar54 = vmovdqa64_avx512vl(auVar87._0_32_);
                  auVar53 = vpermt2d_avx512vl(auVar53,auVar87._0_32_,auVar88);
                  auVar88 = auVar89._0_32_;
                  auVar49 = vpermt2d_avx512vl(auVar53,auVar88,auVar49);
                  auVar53 = vmovdqa64_avx512vl(auVar88);
                  auVar55 = vpermt2d_avx512vl(auVar49,auVar88,auVar55);
                  auVar49 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar49 = vpermt2d_avx512vl(auVar55,auVar49,auVar50);
                  auVar86 = ZEXT3264(auVar49);
                  bVar22 = bVar25;
                  do {
                    auVar50 = auVar86._0_32_;
                    auVar49 = vpermps_avx512vl(auVar79._0_32_,auVar52);
                    auVar52 = valignd_avx512vl(auVar52,auVar52,1);
                    vpermt2q_avx512vl(auVar47,auVar52,auVar48);
                    bVar22 = bVar22 - 1 & bVar22;
                    uVar14 = vpcmpd_avx512vl(auVar49,auVar50,5);
                    auVar49 = vpmaxsd_avx2(auVar49,auVar50);
                    bVar15 = (byte)uVar14 << 1;
                    auVar50 = valignd_avx512vl(auVar50,auVar50,7);
                    bVar31 = (bool)((byte)uVar14 & 1);
                    bVar6 = (bool)(bVar15 >> 2 & 1);
                    bVar7 = (bool)(bVar15 >> 3 & 1);
                    bVar8 = (bool)(bVar15 >> 4 & 1);
                    bVar9 = (bool)(bVar15 >> 5 & 1);
                    bVar10 = (bool)(bVar15 >> 6 & 1);
                    auVar86 = ZEXT3264(CONCAT428((uint)(bVar15 >> 7) * auVar50._28_4_ |
                                                 (uint)!(bool)(bVar15 >> 7) * auVar49._28_4_,
                                                 CONCAT424((uint)bVar10 * auVar50._24_4_ |
                                                           (uint)!bVar10 * auVar49._24_4_,
                                                           CONCAT420((uint)bVar9 * auVar50._20_4_ |
                                                                     (uint)!bVar9 * auVar49._20_4_,
                                                                     CONCAT416((uint)bVar8 *
                                                                               auVar50._16_4_ |
                                                                               (uint)!bVar8 *
                                                                               auVar49._16_4_,
                                                                               CONCAT412((uint)bVar7
                                                                                         * auVar50.
                                                  _12_4_ | (uint)!bVar7 * auVar49._12_4_,
                                                  CONCAT48((uint)bVar6 * auVar50._8_4_ |
                                                           (uint)!bVar6 * auVar49._8_4_,
                                                           CONCAT44((uint)bVar31 * auVar50._4_4_ |
                                                                    (uint)!bVar31 * auVar49._4_4_,
                                                                    auVar49._0_4_))))))));
                  } while (bVar22 != 0);
                  lVar21 = (ulong)(uint)POPCOUNT((uint)bVar25) + 3;
                  while( true ) {
                    auVar50 = auVar86._0_32_;
                    auVar49 = vpermt2q_avx512vl(auVar47,auVar50,auVar48);
                    uVar24 = auVar49._0_8_;
                    bVar31 = lVar21 == 0;
                    lVar21 = lVar21 + -1;
                    if (bVar31) break;
                    (local_25b0->ptr).ptr = uVar24;
                    auVar49 = vpermd_avx2(auVar50,auVar46);
                    local_25b0->dist = auVar49._0_4_;
                    auVar49 = valignd_avx512vl(auVar50,auVar50,1);
                    auVar86 = ZEXT3264(auVar49);
                    local_25b0 = local_25b0 + 1;
                  }
                  auVar46 = vmovdqa64_avx512vl(auVar51);
                  auVar86 = ZEXT3264(auVar46);
                  auVar46 = vmovdqa64_avx512vl(auVar54);
                  auVar87 = ZEXT3264(auVar46);
                  auVar46 = vmovdqa64_avx512vl(auVar53);
                  auVar89 = ZEXT3264(auVar46);
                  goto LAB_01c5668c;
                }
                auVar51 = vpermi2q_avx512vl(auVar88,auVar47,auVar48);
                uVar24 = auVar51._0_8_;
                auVar51 = vpermt2q_avx512vl(auVar47,auVar50,auVar48);
                (local_25b0->ptr).ptr = auVar51._0_8_;
                auVar50 = vpermd_avx2(auVar50,auVar46);
                local_25b0->dist = auVar50._0_4_;
                auVar50 = vpermt2q_avx512vl(auVar47,auVar55,auVar48);
                local_25b0[1].ptr.ptr = auVar50._0_8_;
                auVar50 = vpermd_avx2(auVar55,auVar46);
                local_25b0[1].dist = auVar50._0_4_;
                auVar47 = vpermt2q_avx512vl(auVar47,auVar49,auVar48);
                local_25b0[2].ptr.ptr = auVar47._0_8_;
                lStack_2600 = 0x28;
                lVar21 = lStack_2600;
                lStack_2600 = 0x30;
              }
            }
            auVar46 = vpermd_avx2(auVar49,auVar46);
            *(int *)((long)&(local_25b0->ptr).ptr + lVar21) = auVar46._0_4_;
            local_25b0 = (StackItemT<embree::NodeRefPtr<8>_> *)
                         ((long)&(local_25b0->ptr).ptr + lStack_2600);
          }
        } while( true );
      }
      goto LAB_01c5666f;
    }
  }
  return;
LAB_01c569ee:
  local_2598 = (ulong)((uint)uVar24 & 0xf) - 8;
  uVar24 = uVar24 & 0xfffffffffffffff0;
  for (local_25a0 = 0; local_25a0 != local_2598; local_25a0 = local_25a0 + 1) {
    lVar21 = local_25a0 * 0xb0;
    auVar35 = *(undefined1 (*) [16])(uVar24 + 0x80 + lVar21);
    auVar66 = *(undefined1 (*) [16])(uVar24 + 0x40 + lVar21);
    auVar32 = *(undefined1 (*) [16])(uVar24 + 0x70 + lVar21);
    auVar34 = *(undefined1 (*) [16])(uVar24 + 0x50 + lVar21);
    auVar36._0_4_ = auVar66._0_4_ * auVar35._0_4_;
    auVar36._4_4_ = auVar66._4_4_ * auVar35._4_4_;
    auVar36._8_4_ = auVar66._8_4_ * auVar35._8_4_;
    auVar36._12_4_ = auVar66._12_4_ * auVar35._12_4_;
    auVar33 = *(undefined1 (*) [16])(uVar24 + 0x60 + lVar21);
    auVar65 = *(undefined1 (*) [16])(uVar24 + 0x30 + lVar21);
    local_2488 = vfmsub231ps_fma(auVar36,auVar32,auVar34);
    auVar40._0_4_ = auVar34._0_4_ * auVar33._0_4_;
    auVar40._4_4_ = auVar34._4_4_ * auVar33._4_4_;
    auVar40._8_4_ = auVar34._8_4_ * auVar33._8_4_;
    auVar40._12_4_ = auVar34._12_4_ * auVar33._12_4_;
    local_2478 = vfmsub231ps_fma(auVar40,auVar35,auVar65);
    auVar41._0_4_ = auVar65._0_4_ * auVar32._0_4_;
    auVar41._4_4_ = auVar65._4_4_ * auVar32._4_4_;
    auVar41._8_4_ = auVar65._8_4_ * auVar32._8_4_;
    auVar41._12_4_ = auVar65._12_4_ * auVar32._12_4_;
    uVar60 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    auVar72._4_4_ = uVar60;
    auVar72._0_4_ = uVar60;
    auVar72._8_4_ = uVar60;
    auVar72._12_4_ = uVar60;
    uVar60 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    auVar73._4_4_ = uVar60;
    auVar73._0_4_ = uVar60;
    auVar73._8_4_ = uVar60;
    auVar73._12_4_ = uVar60;
    fVar56 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar74._4_4_ = fVar56;
    auVar74._0_4_ = fVar56;
    auVar74._8_4_ = fVar56;
    auVar74._12_4_ = fVar56;
    uVar60 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    auVar39._4_4_ = uVar60;
    auVar39._0_4_ = uVar60;
    auVar39._8_4_ = uVar60;
    auVar39._12_4_ = uVar60;
    auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + lVar21),auVar39);
    local_2468 = vfmsub231ps_fma(auVar41,auVar33,auVar66);
    uVar60 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    auVar37._4_4_ = uVar60;
    auVar37._0_4_ = uVar60;
    auVar37._8_4_ = uVar60;
    auVar37._12_4_ = uVar60;
    auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x10 + lVar21),auVar37);
    uVar60 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    auVar38._4_4_ = uVar60;
    auVar38._0_4_ = uVar60;
    auVar38._8_4_ = uVar60;
    auVar38._12_4_ = uVar60;
    auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + lVar21),auVar38);
    auVar39 = vmulps_avx512vl(auVar73,auVar38);
    auVar40 = vfmsub231ps_avx512vl(auVar39,auVar37,auVar74);
    auVar39 = vmulps_avx512vl(auVar74,auVar36);
    auVar41 = vfmsub231ps_avx512vl(auVar39,auVar38,auVar72);
    auVar39 = vmulps_avx512vl(auVar72,auVar37);
    auVar42 = vfmsub231ps_avx512vl(auVar39,auVar36,auVar73);
    auVar75._0_4_ = fVar56 * local_2468._0_4_;
    auVar75._4_4_ = fVar56 * local_2468._4_4_;
    auVar75._8_4_ = fVar56 * local_2468._8_4_;
    auVar75._12_4_ = fVar56 * local_2468._12_4_;
    auVar39 = vfmadd231ps_fma(auVar75,local_2478,auVar73);
    auVar39 = vfmadd231ps_fma(auVar39,local_2488,auVar72);
    auVar43._8_4_ = 0x7fffffff;
    auVar43._0_8_ = 0x7fffffff7fffffff;
    auVar43._12_4_ = 0x7fffffff;
    auVar43 = vandps_avx512vl(auVar39,auVar43);
    auVar35 = vmulps_avx512vl(auVar35,auVar42);
    auVar35 = vfmadd231ps_avx512vl(auVar35,auVar41,auVar32);
    auVar32 = vfmadd231ps_avx512vl(auVar35,auVar40,auVar33);
    auVar35._8_4_ = 0x80000000;
    auVar35._0_8_ = 0x8000000080000000;
    auVar35._12_4_ = 0x80000000;
    auVar35 = vandpd_avx512vl(auVar39,auVar35);
    uVar70 = auVar35._0_4_;
    auVar64._0_4_ = (float)(uVar70 ^ auVar32._0_4_);
    uVar26 = auVar35._4_4_;
    auVar64._4_4_ = (float)(uVar26 ^ auVar32._4_4_);
    uVar71 = auVar35._8_4_;
    auVar64._8_4_ = (float)(uVar71 ^ auVar32._8_4_);
    uVar27 = auVar35._12_4_;
    auVar64._12_4_ = (float)(uVar27 ^ auVar32._12_4_);
    auVar35 = vmulps_avx512vl(auVar34,auVar42);
    auVar35 = vfmadd231ps_avx512vl(auVar35,auVar66,auVar41);
    auVar35 = vfmadd231ps_avx512vl(auVar35,auVar65,auVar40);
    auVar66._0_4_ = (float)(uVar70 ^ auVar35._0_4_);
    auVar66._4_4_ = (float)(uVar26 ^ auVar35._4_4_);
    auVar66._8_4_ = (float)(uVar71 ^ auVar35._8_4_);
    auVar66._12_4_ = (float)(uVar27 ^ auVar35._12_4_);
    auVar35 = ZEXT816(0) << 0x20;
    uVar14 = vcmpps_avx512vl(auVar64,auVar35,5);
    uVar11 = vcmpps_avx512vl(auVar66,auVar35,5);
    uVar12 = vcmpps_avx512vl(auVar39,auVar35,4);
    auVar42._0_4_ = auVar64._0_4_ + auVar66._0_4_;
    auVar42._4_4_ = auVar64._4_4_ + auVar66._4_4_;
    auVar42._8_4_ = auVar64._8_4_ + auVar66._8_4_;
    auVar42._12_4_ = auVar64._12_4_ + auVar66._12_4_;
    uVar13 = vcmpps_avx512vl(auVar42,auVar43,2);
    bVar25 = (byte)uVar14 & (byte)uVar11 & (byte)uVar12 & (byte)uVar13;
    if (bVar25 != 0) {
      auVar69._0_4_ = auVar38._0_4_ * local_2468._0_4_;
      auVar69._4_4_ = auVar38._4_4_ * local_2468._4_4_;
      auVar69._8_4_ = auVar38._8_4_ * local_2468._8_4_;
      auVar69._12_4_ = auVar38._12_4_ * local_2468._12_4_;
      auVar35 = vfmadd213ps_fma(auVar37,local_2478,auVar69);
      auVar35 = vfmadd213ps_fma(auVar36,local_2488,auVar35);
      auVar67._0_4_ = (float)(uVar70 ^ auVar35._0_4_);
      auVar67._4_4_ = (float)(uVar26 ^ auVar35._4_4_);
      auVar67._8_4_ = (float)(uVar71 ^ auVar35._8_4_);
      auVar67._12_4_ = (float)(uVar27 ^ auVar35._12_4_);
      uVar60 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar16._4_4_ = uVar60;
      auVar16._0_4_ = uVar60;
      auVar16._8_4_ = uVar60;
      auVar16._12_4_ = uVar60;
      auVar35 = vmulps_avx512vl(auVar43,auVar16);
      fVar56 = (ray->super_RayK<1>).tfar;
      auVar17._4_4_ = fVar56;
      auVar17._0_4_ = fVar56;
      auVar17._8_4_ = fVar56;
      auVar17._12_4_ = fVar56;
      auVar32 = vmulps_avx512vl(auVar43,auVar17);
      uVar14 = vcmpps_avx512vl(auVar67,auVar32,2);
      uVar11 = vcmpps_avx512vl(auVar35,auVar67,1);
      bVar25 = (byte)uVar14 & (byte)uVar11 & bVar25;
      if (bVar25 != 0) {
        lVar21 = lVar21 + uVar24;
        auVar2._0_4_ = (ray->super_RayK<1>).tfar;
        auVar2._4_4_ = (ray->super_RayK<1>).mask;
        auVar2._8_4_ = (ray->super_RayK<1>).id;
        auVar2._12_4_ = (ray->super_RayK<1>).flags;
        auVar68 = ZEXT1664(auVar2);
        uVar70 = vextractps_avx(auVar2,1);
        auVar35 = vrcp14ps_avx512vl(auVar43);
        auVar18._8_4_ = 0x3f800000;
        auVar18._0_8_ = 0x3f8000003f800000;
        auVar18._12_4_ = 0x3f800000;
        auVar32 = vfnmadd213ps_avx512vl(auVar43,auVar35,auVar18);
        auVar35 = vfmadd132ps_fma(auVar32,auVar35,auVar35);
        fVar56 = auVar35._0_4_;
        local_2498._0_4_ = fVar56 * auVar67._0_4_;
        fVar61 = auVar35._4_4_;
        local_2498._4_4_ = fVar61 * auVar67._4_4_;
        fVar62 = auVar35._8_4_;
        local_2498._8_4_ = fVar62 * auVar67._8_4_;
        fVar63 = auVar35._12_4_;
        local_2498._12_4_ = fVar63 * auVar67._12_4_;
        auVar59 = ZEXT1664(local_2498);
        local_24b8[0] = fVar56 * auVar64._0_4_;
        local_24b8[1] = fVar61 * auVar64._4_4_;
        local_24b8[2] = fVar62 * auVar64._8_4_;
        local_24b8[3] = fVar63 * auVar64._12_4_;
        local_24a8[0] = fVar56 * auVar66._0_4_;
        local_24a8[1] = fVar61 * auVar66._4_4_;
        local_24a8[2] = fVar62 * auVar66._8_4_;
        local_24a8[3] = fVar63 * auVar66._12_4_;
        auVar57._8_4_ = 0x7f800000;
        auVar57._0_8_ = 0x7f8000007f800000;
        auVar57._12_4_ = 0x7f800000;
        auVar35 = vblendmps_avx512vl(auVar57,local_2498);
        auVar44._0_4_ = (uint)(bVar25 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar25 & 1) * 0x7f800000;
        bVar31 = (bool)(bVar25 >> 1 & 1);
        auVar44._4_4_ = (uint)bVar31 * auVar35._4_4_ | (uint)!bVar31 * 0x7f800000;
        bVar31 = (bool)(bVar25 >> 2 & 1);
        auVar44._8_4_ = (uint)bVar31 * auVar35._8_4_ | (uint)!bVar31 * 0x7f800000;
        bVar31 = (bool)(bVar25 >> 3 & 1);
        auVar44._12_4_ = (uint)bVar31 * auVar35._12_4_ | (uint)!bVar31 * 0x7f800000;
        auVar35 = vshufps_avx(auVar44,auVar44,0xb1);
        auVar35 = vminps_avx(auVar35,auVar44);
        auVar66 = vshufpd_avx(auVar35,auVar35,1);
        auVar35 = vminps_avx(auVar66,auVar35);
        uVar14 = vcmpps_avx512vl(auVar44,auVar35,0);
        uVar26 = (uint)bVar25;
        if (((byte)uVar14 & bVar25) != 0) {
          bVar25 = (byte)uVar14 & bVar25;
        }
        uVar71 = 0;
        for (uVar27 = (uint)bVar25; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
          uVar71 = uVar71 + 1;
        }
        local_2590 = local_25a8->scene;
        do {
          auVar35 = auVar59._0_16_;
          uVar27 = uVar71 & 0xff;
          h.geomID = *(uint *)(lVar21 + 0x90 + (ulong)uVar27 * 4);
          pGVar4 = (local_2590->geometries).items[h.geomID].ptr;
          local_25f0 = (byte)uVar26;
          if ((pGVar4->mask & uVar70) == 0) {
            local_25f0 = ~(byte)(1 << (uVar71 & 0x1f)) & local_25f0;
          }
          else {
            pRVar5 = local_25a8->args;
            local_2458 = auVar83._0_32_;
            local_2438 = auVar82._0_32_;
            local_2418 = auVar81._0_32_;
            local_23f8 = auVar80._0_32_;
            local_23d8 = auVar78._0_32_;
            local_23b8 = auVar77._0_32_;
            local_2398 = auVar76._0_32_;
            if (pRVar5->filter == (RTCFilterFunctionN)0x0) {
              args.context = local_25a8->user;
              if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                uVar23 = (ulong)(uVar27 << 2);
                fVar56 = *(float *)((long)local_24b8 + uVar23);
                fVar61 = *(float *)((long)local_24a8 + uVar23);
                (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar23);
                (ray->Ng).field_0.field_0.x = *(float *)(local_2488 + uVar23);
                (ray->Ng).field_0.field_0.y = *(float *)(local_2478 + uVar23);
                (ray->Ng).field_0.field_0.z = *(float *)(local_2468 + uVar23);
                ray->u = fVar56;
                ray->v = fVar61;
                ray->primID = *(uint *)(lVar21 + 0xa0 + uVar23);
                ray->geomID = h.geomID;
                ray->instID[0] = (args.context)->instID[0];
                ray->instPrimID[0] = (args.context)->instPrimID[0];
                break;
              }
            }
            else {
              args.context = local_25a8->user;
            }
            uVar23 = (ulong)(uVar27 * 4);
            h.Ng.field_0.field_0.x = *(float *)(local_2488 + uVar23);
            h.Ng.field_0.field_0.y = *(float *)(local_2478 + uVar23);
            h.Ng.field_0.field_0.z = *(float *)(local_2468 + uVar23);
            h.u = *(float *)((long)local_24b8 + uVar23);
            h.v = *(float *)((long)local_24a8 + uVar23);
            h.primID = *(uint *)(lVar21 + 0xa0 + uVar23);
            h.instID[0] = (args.context)->instID[0];
            h.instPrimID[0] = (args.context)->instPrimID[0];
            (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar23);
            local_25bc = -1;
            args.valid = &local_25bc;
            args.geometryUserPtr = pGVar4->userPtr;
            args.ray = (RTCRayN *)ray;
            args.hit = (RTCHitN *)&h;
            args.N = 1;
            if (((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                ((*pGVar4->intersectionFilterN)(&args), *args.valid != 0)) &&
               ((pRVar5->filter == (RTCFilterFunctionN)0x0 ||
                ((((pRVar5->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                   RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar4->field_8).field_0x2 & 0x40) == 0)) ||
                 ((*pRVar5->filter)(&args), *args.valid != 0)))))) {
              *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
              *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
              *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
              *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
              *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
              *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
              *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
              *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
              *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
            }
            else {
              local_2528 = auVar68._0_4_;
              (ray->super_RayK<1>).tfar = local_2528;
            }
            auVar3._0_4_ = (ray->super_RayK<1>).tfar;
            auVar3._4_4_ = (ray->super_RayK<1>).mask;
            auVar3._8_4_ = (ray->super_RayK<1>).id;
            auVar3._12_4_ = (ray->super_RayK<1>).flags;
            auVar68 = ZEXT1664(auVar3);
            auVar59 = ZEXT1664(auVar35);
            fVar56 = (ray->super_RayK<1>).tfar;
            auVar19._4_4_ = fVar56;
            auVar19._0_4_ = fVar56;
            auVar19._8_4_ = fVar56;
            auVar19._12_4_ = fVar56;
            uVar14 = vcmpps_avx512vl(auVar35,auVar19,2);
            local_25f0 = ~(byte)(1 << (uVar71 & 0x1f)) & local_25f0 & (byte)uVar14;
            uVar70 = vextractps_avx(auVar3,1);
            auVar76 = ZEXT3264(local_2398);
            auVar77 = ZEXT3264(local_23b8);
            auVar78 = ZEXT3264(local_23d8);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(1));
            auVar79 = ZEXT3264(auVar46);
            auVar80 = ZEXT3264(local_23f8);
            auVar81 = ZEXT3264(local_2418);
            auVar82 = ZEXT3264(local_2438);
            auVar83 = ZEXT3264(local_2458);
            auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
            auVar84 = ZEXT3264(auVar46);
            auVar46 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
            auVar85 = ZEXT3264(auVar46);
            auVar35 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
            auVar86 = ZEXT1664(auVar35);
            auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar87 = ZEXT3264(auVar46);
            auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
            auVar89 = ZEXT3264(auVar46);
          }
          uVar26 = (uint)local_25f0;
          if (local_25f0 == 0) break;
          auVar58._8_4_ = 0x7f800000;
          auVar58._0_8_ = 0x7f8000007f800000;
          auVar58._12_4_ = 0x7f800000;
          auVar35 = vblendmps_avx512vl(auVar58,auVar59._0_16_);
          auVar45._0_4_ =
               (uint)(local_25f0 & 1) * auVar35._0_4_ | (uint)!(bool)(local_25f0 & 1) * 0x7f800000;
          bVar31 = (bool)(local_25f0 >> 1 & 1);
          auVar45._4_4_ = (uint)bVar31 * auVar35._4_4_ | (uint)!bVar31 * 0x7f800000;
          bVar31 = (bool)(local_25f0 >> 2 & 1);
          auVar45._8_4_ = (uint)bVar31 * auVar35._8_4_ | (uint)!bVar31 * 0x7f800000;
          bVar31 = (bool)(local_25f0 >> 3 & 1);
          auVar45._12_4_ = (uint)bVar31 * auVar35._12_4_ | (uint)!bVar31 * 0x7f800000;
          auVar35 = vshufps_avx(auVar45,auVar45,0xb1);
          auVar35 = vminps_avx(auVar35,auVar45);
          auVar66 = vshufpd_avx(auVar35,auVar35,1);
          auVar35 = vminps_avx(auVar66,auVar35);
          uVar14 = vcmpps_avx512vl(auVar45,auVar35,0);
          local_25f0 = (byte)uVar14 & local_25f0;
          uVar27 = uVar26;
          if (local_25f0 != 0) {
            uVar27 = (uint)local_25f0;
          }
          uVar71 = 0;
          for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
            uVar71 = uVar71 + 1;
          }
        } while( true );
      }
    }
  }
  fVar56 = (ray->super_RayK<1>).tfar;
  auVar59 = ZEXT3264(CONCAT428(fVar56,CONCAT424(fVar56,CONCAT420(fVar56,CONCAT416(fVar56,CONCAT412(
                                                  fVar56,CONCAT48(fVar56,CONCAT44(fVar56,fVar56)))))
                                               )));
  goto LAB_01c5666f;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }